

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

int __thiscall rlist::listIndex(rlist *this,void *value)

{
  int iVar1;
  rlist *this_00;
  int iVar2;
  listNode *ptr;
  
  ptr = this->rl->head;
  if (ptr == (listNode *)0x0) {
    iVar2 = -1;
  }
  else {
    this->view = ptr;
    this_00 = this;
    iVar1 = 0;
    do {
      iVar2 = iVar1;
      iVar1 = match(this_00,ptr,value);
      if (iVar1 != 0) {
        return iVar2;
      }
      ptr = ptr->next;
      this->view = ptr;
      iVar1 = iVar2 + 1;
    } while (ptr != (listNode *)0x0);
  }
  return iVar2;
}

Assistant:

int rlist::listIndex(void *value){
    int index=-1;
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            index++;
            if(rlist::match(view,value))
                return index;
            view=view->next;  
        }
    }
    return index;
}